

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebuggerObject.cpp
# Opt level: O0

DynamicObject * __thiscall
JsrtDebuggerObjectBase::GetChildren
          (JsrtDebuggerObjectBase *this,
          WeakArenaReference<Js::IDiagObjectModelWalkerBase> *walkerRef,ScriptContext *scriptContext
          ,uint fromCount,uint totalCount)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  JavascriptLibrary *pJVar4;
  DynamicObject *object_00;
  JavascriptArray *instance;
  JavascriptArray *instance_00;
  IDiagObjectModelWalkerBase *pIVar5;
  WeakArenaReference<Js::IDiagObjectModelDisplay> *pWVar6;
  JsrtDebuggerObjectsManager *debuggerObjectsManager;
  undefined4 extraout_var;
  Var pvVar7;
  JsrtDebugPropertyId local_12c;
  JsrtDebugPropertyId local_128;
  JsrtDebugPropertyId local_124 [3];
  JavascriptException *err_2;
  Var marshaledObj;
  DynamicObject *object;
  JsrtDebuggerObjectBase *debuggerObject;
  IDiagObjectModelDisplay *resolvedObjectDisplay;
  AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
  objectDisplayWeakRef;
  Var error;
  JavascriptExceptionObject *exception;
  JavascriptException *err_1;
  ResolvedObject resolvedObject;
  uint32 i;
  JavascriptException *err;
  uint32 local_74;
  uint32 childrensCount;
  IDiagObjectModelWalkerBase *walker;
  JavascriptArray *debuggerOnlyPropertiesArray;
  uint debuggerOnlyPropertiesArrayCount;
  JavascriptArray *propertiesArray;
  uint propertiesArrayCount;
  DynamicObject *childrensObject;
  uint totalCount_local;
  uint fromCount_local;
  ScriptContext *scriptContext_local;
  WeakArenaReference<Js::IDiagObjectModelWalkerBase> *walkerRef_local;
  JsrtDebuggerObjectBase *this_local;
  TypeId typeId;
  
  pJVar4 = Js::ScriptContext::GetLibrary(scriptContext);
  object_00 = Js::JavascriptLibrary::CreateObject(pJVar4,false,0);
  propertiesArray._4_4_ = 0;
  pJVar4 = Js::ScriptContext::GetLibrary(scriptContext);
  instance = Js::JavascriptLibrary::CreateArray(pJVar4);
  debuggerOnlyPropertiesArray._4_4_ = 0;
  pJVar4 = Js::ScriptContext::GetLibrary(scriptContext);
  instance_00 = Js::JavascriptLibrary::CreateArray(pJVar4);
  pIVar5 = Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::GetStrongReference(walkerRef)
  ;
  local_74 = 0;
  if (pIVar5 != (IDiagObjectModelWalkerBase *)0x0) {
    local_74 = (*pIVar5->_vptr_IDiagObjectModelWalkerBase[1])();
    uVar1 = fromCount;
    if (fromCount < local_74) {
      while (resolvedObject._60_4_ = uVar1,
            (uint)resolvedObject._60_4_ < local_74 &&
            propertiesArray._4_4_ + debuggerOnlyPropertiesArray._4_4_ < totalCount) {
        Js::ResolvedObject::ResolvedObject((ResolvedObject *)&err_1);
        (**pIVar5->_vptr_IDiagObjectModelWalkerBase)
                  (pIVar5,(ulong)(uint)resolvedObject._60_4_,(ResolvedObject *)&err_1);
        pWVar6 = Js::ResolvedObject::GetObjectDisplay((ResolvedObject *)&err_1);
        AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>::
        AutoPtr((AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
                 *)&resolvedObjectDisplay,pWVar6);
        pWVar6 = BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>::operator->
                           ((BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_> *)
                            &resolvedObjectDisplay);
        debuggerObject =
             (JsrtDebuggerObjectBase *)
             Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::GetStrongReference(pWVar6);
        if (debuggerObject != (JsrtDebuggerObjectBase *)0x0) {
          debuggerObjectsManager = GetDebuggerObjectsManager(this);
          pWVar6 = BasePtr::operator_cast_to_WeakArenaReference_((BasePtr *)&resolvedObjectDisplay);
          object = (DynamicObject *)JsrtDebuggerObjectProperty::Make(debuggerObjectsManager,pWVar6);
          iVar2 = (*(object->super_RecyclableObject).super_FinalizableObject.
                    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[2])
                            (object,resolvedObject._0_8_,0);
          marshaledObj = (Var)CONCAT44(extraout_var,iVar2);
          err_2 = (JavascriptException *)Js::CrossSite::MarshalVar(scriptContext,marshaledObj,false)
          ;
          uVar3 = (*debuggerObject->_vptr_JsrtDebuggerObjectBase[0xc])();
          if ((uVar3 & 1) == 0) {
            pvVar7 = Js::JavascriptNumber::ToVar(propertiesArray._4_4_,scriptContext);
            Js::JavascriptOperators::OP_SetElementI
                      (instance,pvVar7,err_2,scriptContext,PropertyOperation_None);
            propertiesArray._4_4_ = propertiesArray._4_4_ + 1;
          }
          else {
            pvVar7 = Js::JavascriptNumber::ToVar(debuggerOnlyPropertiesArray._4_4_,scriptContext);
            Js::JavascriptOperators::OP_SetElementI
                      (instance_00,pvVar7,err_2,scriptContext,PropertyOperation_None);
            debuggerOnlyPropertiesArray._4_4_ = debuggerOnlyPropertiesArray._4_4_ + 1;
          }
          pWVar6 = BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>::operator->
                             ((BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_> *)
                              &resolvedObjectDisplay);
          Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>::ReleaseStrongReference(pWVar6);
          BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_>::Detach
                    ((BasePtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>_> *)
                     &resolvedObjectDisplay);
        }
        AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>::
        ~AutoPtr((AutoPtr<Memory::WeakArenaReference<Js::IDiagObjectModelDisplay>,_Memory::HeapAllocator>
                  *)&resolvedObjectDisplay);
        uVar1 = resolvedObject._60_4_ + 1;
      }
    }
    Memory::WeakArenaReference<Js::IDiagObjectModelWalkerBase>::ReleaseStrongReference(walkerRef);
  }
  JsrtDebugPropertyId::JsrtDebugPropertyId(local_124,totalPropertiesOfObject);
  JsrtDebugUtils::AddPropertyToObject(object_00,local_124[0],local_74,scriptContext);
  JsrtDebugPropertyId::JsrtDebugPropertyId(&local_128,properties);
  JsrtDebugUtils::AddPropertyToObject(object_00,local_128,instance,scriptContext);
  JsrtDebugPropertyId::JsrtDebugPropertyId(&local_12c,debuggerOnlyProperties);
  JsrtDebugUtils::AddPropertyToObject(object_00,local_12c,instance_00,scriptContext);
  return object_00;
}

Assistant:

Js::DynamicObject * JsrtDebuggerObjectBase::GetChildren(WeakArenaReference<Js::IDiagObjectModelWalkerBase>* walkerRef, Js::ScriptContext * scriptContext, uint fromCount, uint totalCount)
{
    Js::DynamicObject* childrensObject = scriptContext->GetLibrary()->CreateObject();

    uint propertiesArrayCount = 0;
    Js::JavascriptArray* propertiesArray = scriptContext->GetLibrary()->CreateArray();

    uint debuggerOnlyPropertiesArrayCount = 0;
    Js::JavascriptArray* debuggerOnlyPropertiesArray = scriptContext->GetLibrary()->CreateArray();

    Js::IDiagObjectModelWalkerBase* walker = walkerRef->GetStrongReference();

    uint32 childrensCount = 0;

    if (walker != nullptr)
    {
        try
        {
            childrensCount = walker->GetChildrenCount();
        }
        catch (const Js::JavascriptException& err)
        {
            err.GetAndClear();  // discard exception object
        }

        if (fromCount < childrensCount)
        {
            for (uint32 i = fromCount; i < childrensCount && (propertiesArrayCount + debuggerOnlyPropertiesArrayCount) < totalCount; ++i)
            {
                Js::ResolvedObject resolvedObject;

                try
                {
                    walker->Get(i, &resolvedObject);
                }
                catch (const Js::JavascriptException& err)
                {
                    Js::JavascriptExceptionObject* exception = err.GetAndClear();
                    Js::Var error = exception->GetThrownObject(scriptContext);
                    resolvedObject.obj = error;
                    resolvedObject.address = nullptr;
                    resolvedObject.scriptContext = exception->GetScriptContext();
                    resolvedObject.typeId = Js::JavascriptOperators::GetTypeId(error);
                    resolvedObject.name = _u("{error}");
                    resolvedObject.propId = Js::Constants::NoProperty;
                }

                AutoPtr<WeakArenaReference<Js::IDiagObjectModelDisplay>> objectDisplayWeakRef(resolvedObject.GetObjectDisplay());
                Js::IDiagObjectModelDisplay* resolvedObjectDisplay = objectDisplayWeakRef->GetStrongReference();
                if (resolvedObjectDisplay != nullptr)
                {
                    JsrtDebuggerObjectBase* debuggerObject = JsrtDebuggerObjectProperty::Make(this->GetDebuggerObjectsManager(), objectDisplayWeakRef);
                    try
                    {
                        Js::DynamicObject* object = debuggerObject->GetJSONObject(resolvedObject.scriptContext, /* forceSetValueProp */ false);
                        Js::Var marshaledObj = Js::CrossSite::MarshalVar(scriptContext, object);
                        if (resolvedObjectDisplay->IsFake())
                        {
                            Js::JavascriptOperators::OP_SetElementI((Js::Var)debuggerOnlyPropertiesArray, Js::JavascriptNumber::ToVar(debuggerOnlyPropertiesArrayCount++, scriptContext), marshaledObj, scriptContext);
                        }
                        else
                        {
                            Js::JavascriptOperators::OP_SetElementI((Js::Var)propertiesArray, Js::JavascriptNumber::ToVar(propertiesArrayCount++, scriptContext), marshaledObj, scriptContext);
                        }
                    }
                    catch (const Js::JavascriptException& err)
                    {
                        err.GetAndClear();   // discard exception object
                    }
                    objectDisplayWeakRef->ReleaseStrongReference();
                    objectDisplayWeakRef.Detach();
                }
            }
        }

        walkerRef->ReleaseStrongReference();
    }

    JsrtDebugUtils::AddPropertyToObject(childrensObject, JsrtDebugPropertyId::totalPropertiesOfObject, childrensCount, scriptContext);
    JsrtDebugUtils::AddPropertyToObject(childrensObject, JsrtDebugPropertyId::properties, propertiesArray, scriptContext);
    JsrtDebugUtils::AddPropertyToObject(childrensObject, JsrtDebugPropertyId::debuggerOnlyProperties, debuggerOnlyPropertiesArray, scriptContext);

    return childrensObject;
}